

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

Token * __thiscall lexer::Lexer::NextToken(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  char cVar2;
  int v;
  iterator iVar3;
  Lexer *this_00;
  string *psVar4;
  Word WStack_398;
  string literal;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  __return_storage_ptr__->_vptr_Token = (_func_int **)&PTR__Token_001688f0;
  (__return_storage_ptr__->Literal)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Literal).field_2;
  (__return_storage_ptr__->Literal)._M_string_length = 0;
  (__return_storage_ptr__->Literal).field_2._M_local_buf[0] = '\0';
  this_00 = this;
  skipWhiteSpace(this);
  cVar2 = this->curChar;
  switch(cVar2) {
  case '!':
    cVar2 = peekChar(this);
    if (cVar2 == '=') {
      cVar2 = this->curChar;
      readChar(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&literal,"",(allocator<char> *)&WStack_398);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&literal,cVar2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&literal,this->curChar);
      std::__cxx11::string::string((string *)&local_1e8,&literal);
      Operator::Operator((Operator *)&WStack_398,NOT_EQ,&local_1e8);
      token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
      Operator::~Operator((Operator *)&WStack_398);
      psVar4 = &local_1e8;
LAB_0011a640:
      std::__cxx11::string::~string((string *)psVar4);
      psVar4 = &literal;
    }
    else {
      local_208.field_2._M_local_buf[0] = this->curChar;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208._M_string_length = 1;
      local_208.field_2._M_local_buf[1] = '\0';
      Operator::Operator((Operator *)&WStack_398,BANG,&local_208);
      token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
      Operator::~Operator((Operator *)&WStack_398);
      psVar4 = &local_208;
    }
    break;
  case '\"':
  case '#':
  case '$':
  case '%':
  case '&':
  case '\'':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case ':':
  case ';':
switchD_00119d38_caseD_22:
    bVar1 = isLetter(this_00,cVar2);
    if (bVar1) {
      readIdent_abi_cxx11_(&literal,this);
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&keywords_abi_cxx11_._M_h,&literal);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__cxx11::string::string((string *)&local_2e8,&literal);
        Word::Word(&WStack_398,ID,&local_2e8);
        token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
        Word::~Word(&WStack_398);
        std::__cxx11::string::~string((string *)&local_2e8);
      }
      else {
        token::Token::operator=
                  (__return_storage_ptr__,
                   (Token *)((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>,_true>
                                   ._M_cur + 0x28));
      }
      std::__cxx11::string::~string((string *)&literal);
      return __return_storage_ptr__;
    }
    if ((int)cVar2 - 0x30U < 10) {
      readInt_abi_cxx11_((string *)&WStack_398,this);
      v = std::__cxx11::stoi((string *)&WStack_398,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&WStack_398);
      Num::Num((Num *)&WStack_398,v);
      token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
      token::Token::~Token(&WStack_398.super_Token);
      return __return_storage_ptr__;
    }
    if ((cVar2 == '\'') || (cVar2 == '\"')) {
      readStringLiteral_abi_cxx11_(&literal,this,cVar2);
      std::__cxx11::string::string((string *)&local_308,&literal);
      Word::Word(&WStack_398,LITERAL,&local_308);
      token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
      Word::~Word(&WStack_398);
      psVar4 = &local_308;
      goto LAB_0011a640;
    }
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    local_328._M_string_length = 1;
    local_328.field_2._M_local_buf[1] = '\0';
    local_328.field_2._M_local_buf[0] = cVar2;
    token::Token::Token(&WStack_398.super_Token,INVALID,&local_328);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    token::Token::~Token(&WStack_398.super_Token);
    psVar4 = &local_328;
    break;
  case '(':
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288.field_2._M_allocated_capacity._0_2_ = 0x28;
    local_288._M_string_length = 1;
    Symbol::Symbol((Symbol *)&WStack_398,LPAREN,&local_288);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    Symbol::~Symbol((Symbol *)&WStack_398);
    psVar4 = &local_288;
    break;
  case ')':
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    local_2a8.field_2._M_allocated_capacity._0_2_ = 0x29;
    local_2a8._M_string_length = 1;
    Symbol::Symbol((Symbol *)&WStack_398,RPAREN,&local_2a8);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    Symbol::~Symbol((Symbol *)&WStack_398);
    psVar4 = &local_2a8;
    break;
  case '*':
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8.field_2._M_allocated_capacity._0_2_ = 0x2a;
    local_e8._M_string_length = 1;
    Operator::Operator((Operator *)&WStack_398,ASTERISK,&local_e8);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    Operator::~Operator((Operator *)&WStack_398);
    psVar4 = &local_e8;
    break;
  case '+':
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8.field_2._M_allocated_capacity._0_2_ = 0x2b;
    local_a8._M_string_length = 1;
    Operator::Operator((Operator *)&WStack_398,PLUS,&local_a8);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    Operator::~Operator((Operator *)&WStack_398);
    psVar4 = &local_a8;
    break;
  case ',':
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    local_228.field_2._M_allocated_capacity._0_2_ = 0x2c;
    local_228._M_string_length = 1;
    Symbol::Symbol((Symbol *)&WStack_398,COMMA,&local_228);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    Symbol::~Symbol((Symbol *)&WStack_398);
    psVar4 = &local_228;
    break;
  case '-':
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8.field_2._M_allocated_capacity._0_2_ = 0x2d;
    local_c8._M_string_length = 1;
    Operator::Operator((Operator *)&WStack_398,MINUS,&local_c8);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    Operator::~Operator((Operator *)&WStack_398);
    psVar4 = &local_c8;
    break;
  case '.':
    cVar2 = peekChar(this);
    if (cVar2 == '.') {
      cVar2 = this->curChar;
      readChar(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&literal,"",(allocator<char> *)&WStack_398);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&literal,cVar2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&literal,this->curChar);
      std::__cxx11::string::string((string *)&local_48,&literal);
      token::Token::Token(&WStack_398.super_Token,RANGE,&local_48);
      token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
      token::Token::~Token(&WStack_398.super_Token);
      psVar4 = &local_48;
      goto LAB_0011a640;
    }
    local_68.field_2._M_local_buf[0] = this->curChar;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 1;
    local_68.field_2._M_local_buf[1] = '\0';
    token::Token::Token(&WStack_398.super_Token,INVALID,&local_68);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    token::Token::~Token(&WStack_398.super_Token);
    psVar4 = &local_68;
    break;
  case '/':
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    local_108.field_2._M_allocated_capacity._0_2_ = 0x2f;
    local_108._M_string_length = 1;
    Operator::Operator((Operator *)&WStack_398,DIV,&local_108);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    Operator::~Operator((Operator *)&WStack_398);
    psVar4 = &local_108;
    break;
  case '<':
    cVar2 = peekChar(this);
    if (cVar2 == '=') {
      cVar2 = this->curChar;
      readChar(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&literal,"",(allocator<char> *)&WStack_398);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&literal,cVar2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&literal,this->curChar);
      std::__cxx11::string::string((string *)&local_128,&literal);
      Operator::Operator((Operator *)&WStack_398,LT_EQ,&local_128);
      token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
      Operator::~Operator((Operator *)&WStack_398);
      psVar4 = &local_128;
      goto LAB_0011a640;
    }
    local_148.field_2._M_local_buf[0] = this->curChar;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_148._M_string_length = 1;
    local_148.field_2._M_local_buf[1] = '\0';
    Operator::Operator((Operator *)&WStack_398,LT,&local_148);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    Operator::~Operator((Operator *)&WStack_398);
    psVar4 = &local_148;
    break;
  case '=':
    cVar2 = peekChar(this);
    if (cVar2 == '=') {
      cVar2 = this->curChar;
      readChar(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&literal,"",(allocator<char> *)&WStack_398);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&literal,cVar2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&literal,this->curChar);
      std::__cxx11::string::string((string *)&local_1a8,&literal);
      Operator::Operator((Operator *)&WStack_398,EQ,&local_1a8);
      token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
      Operator::~Operator((Operator *)&WStack_398);
      psVar4 = &local_1a8;
      goto LAB_0011a640;
    }
    local_1c8.field_2._M_local_buf[0] = this->curChar;
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    local_1c8._M_string_length = 1;
    local_1c8.field_2._M_local_buf[1] = '\0';
    Operator::Operator((Operator *)&WStack_398,ASSIGN,&local_1c8);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    Operator::~Operator((Operator *)&WStack_398);
    psVar4 = &local_1c8;
    break;
  case '>':
    cVar2 = peekChar(this);
    if (cVar2 == '=') {
      cVar2 = this->curChar;
      readChar(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&literal,"",(allocator<char> *)&WStack_398);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&literal,cVar2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&literal,this->curChar);
      std::__cxx11::string::string((string *)&local_168,&literal);
      Operator::Operator((Operator *)&WStack_398,GT_EQ,&local_168);
      token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
      Operator::~Operator((Operator *)&WStack_398);
      psVar4 = &local_168;
      goto LAB_0011a640;
    }
    local_188.field_2._M_local_buf[0] = this->curChar;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    local_188._M_string_length = 1;
    local_188.field_2._M_local_buf[1] = '\0';
    Operator::Operator((Operator *)&WStack_398,GT,&local_188);
    token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
    Operator::~Operator((Operator *)&WStack_398);
    psVar4 = &local_188;
    break;
  default:
    if (cVar2 == '\0') {
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      local_2c8.field_2._M_allocated_capacity._0_2_ = 0;
      local_2c8._M_string_length = 1;
      token::Token::Token(&WStack_398.super_Token,EOB,&local_2c8);
      token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
      token::Token::~Token(&WStack_398.super_Token);
      psVar4 = &local_2c8;
    }
    else {
      if (cVar2 == '\n') {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        local_88.field_2._M_allocated_capacity._0_2_ = 10;
        local_88._M_string_length = 1;
        Symbol::Symbol((Symbol *)&WStack_398,NEWLINE,&local_88);
        token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
        Symbol::~Symbol((Symbol *)&WStack_398);
        std::__cxx11::string::~string((string *)&local_88);
        this->line = this->line + 1;
        goto LAB_0011a64f;
      }
      if (cVar2 == '{') {
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        local_248.field_2._M_allocated_capacity._0_2_ = 0x7b;
        local_248._M_string_length = 1;
        Symbol::Symbol((Symbol *)&WStack_398,LBRACE,&local_248);
        token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
        Symbol::~Symbol((Symbol *)&WStack_398);
        psVar4 = &local_248;
      }
      else {
        if (cVar2 != '}') goto switchD_00119d38_caseD_22;
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        local_268.field_2._M_allocated_capacity._0_2_ = 0x7d;
        local_268._M_string_length = 1;
        Symbol::Symbol((Symbol *)&WStack_398,RBRACE,&local_268);
        token::Token::operator=(__return_storage_ptr__,&WStack_398.super_Token);
        Symbol::~Symbol((Symbol *)&WStack_398);
        psVar4 = &local_268;
      }
    }
  }
  std::__cxx11::string::~string((string *)psVar4);
LAB_0011a64f:
  readChar(this);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::NextToken()
{
    Token tok;
    skipWhiteSpace();

    switch (curChar) {
    case '.':
        if (peekChar() == '.'){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Token(TokenType::RANGE, literal);
        }else{
            tok = Token(TokenType::INVALID, std::string(1, curChar));
        }
        break;
    case '\n':
        tok = Symbol(TokenType::NEWLINE, std::string(1, curChar));
        line++;
        break;
    case '+':
        tok = Operator(TokenType::PLUS, std::string(1, curChar));
        break;
    case '-':
        tok = Operator(TokenType::MINUS, std::string(1, curChar));
        break;
    case '*':
        tok = Operator(TokenType::ASTERISK, std::string(1, curChar));
        break;
    case '/':
        tok = Operator(TokenType::DIV, std::string(1, curChar));
        break;
    case '<':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::LT_EQ, literal);
        }else{
            tok = Operator(TokenType::LT, std::string(1, curChar));
        }
        break;
    case '>':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::GT_EQ, literal);
        }else{
            tok = Operator(TokenType::GT, std::string(1, curChar));
        }

        break;
    case '=':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::EQ, literal);
        }else{
            tok = Operator(TokenType::ASSIGN, std::string(1, curChar));
        }
        break;
    case '!':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::NOT_EQ, literal);
        }else{
            tok = Operator(TokenType::BANG, std::string(1, curChar));
        }
        break;
    case ',':
        tok = Symbol(TokenType::COMMA, std::string(1, curChar));
        break;
    case '{':
        tok = Symbol(TokenType::LBRACE, std::string(1, curChar));
        break;
    case '}':
        tok = Symbol(TokenType::RBRACE, std::string(1, curChar));
        break;
    case '(':
        tok = Symbol(TokenType::LPAREN, std::string(1, curChar));
        break;
    case ')':
        tok = Symbol(TokenType::RPAREN, std::string(1, curChar));
        break;
    case '\0':
        tok = Token(TokenType::EOB, std::string(1, curChar));
        break;
    default:
        if (isLetter(curChar)){
            std::string literal = readIdent();
            auto wsrch = Lexer::keywords.find(literal);
            if(wsrch != Lexer::keywords.end())
                tok  = wsrch->second;
            else
                tok = Word(TokenType::ID, literal);
            return tok;
        }else if (isDigit(curChar)){
            int val = std::stoi(readInt());
            tok = Num(val);
            return tok;
        }else if(curChar == '\'' || curChar == '"'){
            std::string literal = readStringLiteral(curChar);
            tok = Word(TokenType::LITERAL, literal);
        }
        else{
           tok = Token(TokenType::INVALID, std::string(1, curChar));
        }

    }
    readChar();
    return tok;
}